

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# median.h
# Opt level: O0

uint pseudo_median<unsigned_int>(uchar **strings,size_t N,size_t depth)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint a;
  uint b;
  uint c;
  size_t depth_local;
  size_t N_local;
  uchar **strings_local;
  
  if (N < 0x1f) {
    uVar1 = get_char<unsigned_int>(*strings,depth);
    uVar2 = get_char<unsigned_int>(strings[N >> 1],depth);
    uVar3 = get_char<unsigned_int>(strings[N - 1],depth);
    strings_local._4_4_ = med3char<unsigned_int>(uVar1,uVar2,uVar3);
  }
  else {
    uVar1 = get_char<unsigned_int>(*strings,depth);
    uVar2 = get_char<unsigned_int>(strings[1],depth);
    uVar3 = get_char<unsigned_int>(strings[2],depth);
    a = med3char<unsigned_int>(uVar1,uVar2,uVar3);
    uVar1 = get_char<unsigned_int>(strings[N >> 1],depth);
    uVar2 = get_char<unsigned_int>(strings[(N >> 1) + 1],depth);
    uVar3 = get_char<unsigned_int>(strings[(N >> 1) + 2],depth);
    b = med3char<unsigned_int>(uVar1,uVar2,uVar3);
    uVar1 = get_char<unsigned_int>(strings[N - 3],depth);
    uVar2 = get_char<unsigned_int>(strings[N - 2],depth);
    uVar3 = get_char<unsigned_int>(strings[N - 1],depth);
    c = med3char<unsigned_int>(uVar1,uVar2,uVar3);
    strings_local._4_4_ = med3char<unsigned_int>(a,b,c);
  }
  return strings_local._4_4_;
}

Assistant:

CharT
pseudo_median(unsigned char** strings, size_t N, size_t depth)
{
	if (N > 30)
		return med3char(
			med3char(
				get_char<CharT>(strings[0], depth),
				get_char<CharT>(strings[1], depth),
				get_char<CharT>(strings[2], depth)
				),
			med3char(
				get_char<CharT>(strings[N/2  ], depth),
				get_char<CharT>(strings[N/2+1], depth),
				get_char<CharT>(strings[N/2+2], depth)
				),
			med3char(
				get_char<CharT>(strings[N-3], depth),
				get_char<CharT>(strings[N-2], depth),
				get_char<CharT>(strings[N-1], depth)
				)
		       );
	else
		return med3char(get_char<CharT>(strings[0  ], depth),
				get_char<CharT>(strings[N/2], depth),
				get_char<CharT>(strings[N-1], depth));
}